

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

QByteArray *
QtDebugUtils::toPrintable
          (QByteArray *__return_storage_ptr__,char *data,qint64 len,qsizetype maxSize)

{
  byte ch;
  uint uVar1;
  qint64 qVar2;
  char *s;
  long lVar3;
  long in_FS_OFFSET;
  char local_3d [3];
  char local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (data == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QByteArray::QByteArray(__return_storage_ptr__,"(null)",-1);
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    qVar2 = maxSize;
    if (len < maxSize) {
      qVar2 = len;
    }
    lVar3 = 0;
    if (qVar2 < 1) {
      qVar2 = lVar3;
    }
    for (; qVar2 != lVar3; lVar3 = lVar3 + 1) {
      ch = data[lVar3];
      uVar1 = (uint)ch;
      if ((int)(char)ch - 0x7fU < 0xffffffa1) {
        if (uVar1 == 9) {
          s = "\\t";
        }
        else {
          s = "\\n";
          if (uVar1 != 10) {
            if (uVar1 != 0xd) {
              local_3d[0] = '\\';
              local_3d[1] = 'x';
              local_3d[2] = "0123456789abcdef"[ch >> 4];
              local_3a = "0123456789abcdef"[uVar1 & 0xf];
              local_39 = 0;
              QByteArray::append(__return_storage_ptr__,local_3d);
              goto LAB_0020f615;
            }
            s = "\\r";
          }
        }
        QByteArray::append(__return_storage_ptr__,s);
      }
      else {
        QByteArray::append(__return_storage_ptr__,ch);
      }
LAB_0020f615:
    }
    if (maxSize < len) {
      QByteArray::append(__return_storage_ptr__,"...");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QtDebugUtils::toPrintable(const char *data, qint64 len, qsizetype maxSize)
{
    if (!data)
        return "(null)";

    QByteArray out;
    for (qsizetype i = 0; i < qMin(len, maxSize); ++i) {
        char c = data[i];
        if (isAsciiPrintable(c)) {
            out += c;
        } else {
            switch (c) {
            case '\n':
                out += "\\n";
                break;
            case '\r':
                out += "\\r";
                break;
            case '\t':
                out += "\\t";
                break;
            default: {
                const char buf[] = {
                    '\\',
                    'x',
                    toHexLower(uchar(c) / 16),
                    toHexLower(uchar(c) % 16),
                    0
                };
                out += buf;
            }
            }
        }
    }

    if (maxSize < len)
        out += "...";

    return out;
}